

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_can_study(player *p,_Bool show_msg)

{
  undefined8 p_00;
  _Bool _Var1;
  magic_realm *p_01;
  char local_a8 [8];
  char buf [120];
  magic_realm *r1;
  magic_realm *r;
  wchar_t count;
  _Bool show_msg_local;
  player *p_local;
  
  r._7_1_ = show_msg;
  _count = p;
  _Var1 = player_can_cast(p,show_msg);
  if (_Var1) {
    if (_count->upkeep->new_spells == L'\0') {
      if ((r._7_1_ & 1) != 0) {
        p_01 = class_magic_realms(_count->class,(int *)&r);
        my_strcpy(local_a8,p_01->spell_noun,0x78);
        my_strcat(local_a8,"s",0x78);
        buf._112_8_ = p_01->next;
        mem_free(p_01);
        if (1 < (int)r) {
          while (p_00 = buf._112_8_, buf._112_8_ != 0) {
            r._0_4_ = (int)r + -1;
            if ((int)r == 0) {
              my_strcat(local_a8," or ",0x78);
            }
            else {
              my_strcat(local_a8,", ",0x78);
            }
            my_strcat(local_a8,*(char **)(p_00 + 0x28),0x78);
            my_strcat(local_a8,"s",0x78);
            buf._112_8_ = *(undefined8 *)p_00;
            mem_free((void *)p_00);
          }
        }
        msg("You cannot learn any new %s!",local_a8);
      }
      p_local._7_1_ = false;
    }
    else {
      p_local._7_1_ = true;
    }
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool player_can_study(const struct player *p, bool show_msg)
{
	if (!player_can_cast(p, show_msg))
		return false;

	if (!p->upkeep->new_spells) {
		if (show_msg) {
			int count;
			struct magic_realm *r = class_magic_realms(p->class, &count), *r1;
			char buf[120];

			my_strcpy(buf, r->spell_noun, sizeof(buf));
			my_strcat(buf, "s", sizeof(buf));
			r1 = r->next;
			mem_free(r);
			r = r1;
			if (count > 1) {
				while (r) {
					count--;
					if (count) {
						my_strcat(buf, ", ", sizeof(buf));
					} else {
						my_strcat(buf, " or ", sizeof(buf));
					}
					my_strcat(buf, r->spell_noun, sizeof(buf));
					my_strcat(buf, "s", sizeof(buf));
					r1 = r->next;
					mem_free(r);
					r = r1;
				}
			}
			msg("You cannot learn any new %s!", buf);
		}
		return false;
	}

	return true;
}